

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::SingleFieldGenerator::WantsHasProperty
          (SingleFieldGenerator *this)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  long in_RDI;
  undefined1 local_1;
  
  pOVar2 = FieldDescriptor::containing_oneof(*(FieldDescriptor **)(in_RDI + 8));
  if (pOVar2 == (OneofDescriptor *)0x0) {
    FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
    bVar1 = HasFieldPresence((FileDescriptor *)0x5abd5d);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SingleFieldGenerator::WantsHasProperty(void) const {
  if (descriptor_->containing_oneof() != NULL) {
    // If in a oneof, it uses the oneofcase instead of a has bit.
    return false;
  }
  if (HasFieldPresence(descriptor_->file())) {
    // In proto1/proto2, every field has a has_$name$() method.
    return true;
  }
  return false;
}